

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O2

entity_t flecs::_::component_info<Position>::id(world_t *world,char *name,bool allow_tag)

{
  _Bool _Var1;
  size_t sVar2;
  
  if (s_id != 0) {
    if (world == (world_t *)0x0) goto LAB_00109db4;
    _Var1 = ecs_exists(world,s_id);
    if (_Var1) goto LAB_00109db4;
  }
  id_no_lifecycle(world,name,allow_tag);
  sVar2 = size();
  if (sVar2 != 0) {
    register_lifecycle_actions<Position>(world,s_id,true,true,true,true);
  }
LAB_00109db4:
  _ecs_assert(s_id != 0,0xc,(char *)0x0,"s_id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xe0c);
  if (s_id != 0) {
    return s_id;
  }
  __assert_fail("s_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xe0c,
                "static entity_t flecs::_::component_info<Position>::id(world_t *, const char *, bool) [T = Position]"
               );
}

Assistant:

static entity_t id(world_t *world = nullptr, const char *name = nullptr, 
        bool allow_tag = true) 
    {
        // If no id has been registered yet, do it now.
        if (!s_id || (world && !ecs_exists(world, s_id))) {
            // This will register a component id, but will not register 
            // lifecycle callbacks.
            id_no_lifecycle(world, name, allow_tag);

            // Register lifecycle callbacks, but only if the component has a
            // size. Components that don't have a size are tags, and tags don't
            // require construction/destruction/copy/move's. */
            if (size()) {
                register_lifecycle_actions<T>(world, s_id,
                    true, true, true, true);
            }
        }

        // By now we should have a valid identifier
        ecs_assert(s_id != 0, ECS_INTERNAL_ERROR, NULL);

        return s_id;
    }